

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

RepeatedField<float> * __thiscall
google::protobuf::RepeatedField<float>::operator=
          (RepeatedField<float> *this,RepeatedField<float> *other)

{
  RepeatedField<float> *in_RSI;
  RepeatedField<float> *in_RDI;
  
  if (in_RDI != in_RSI) {
    CopyFrom(in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    const RepeatedField& other) {
  if (this != &other) CopyFrom(other);
  return *this;
}